

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.c
# Opt level: O1

void state_clear(state_t *state)

{
  state->engine = (engine_state_t *)0x0;
  state->flag_quit = 0;
  state->flag_searching = 0;
  state->moves_left_in_period = 0;
  state->time_incremental_ms = 0;
  state->time_left_ms = 0;
  return;
}

Assistant:

void state_clear(state_t *state)
{
    state->engine = NULL;
    state->flag_quit = 0;
    state->flag_searching = 0;
    state->moves_left_in_period = 0;
    state->time_incremental_ms = 0;
    state->time_left_ms = 0;
}